

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::ConfidentialTransactionController::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionController *this,Txid *txid,
          uint32_t vout,Pubkey *pubkey,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  Script script;
  ByteData local_a0;
  ByteData256 local_88;
  SigHashType local_6c;
  Script local_60;
  
  core::ScriptUtil::CreateP2pkhLockingScript(&local_60,pubkey);
  txin_index = core::ConfidentialTransaction::GetTxInIndex(&this->transaction_,txid,vout);
  core::Script::GetData(&local_a0,&local_60);
  core::SigHashType::SigHashType(&local_6c,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            (&local_88,&this->transaction_,txin_index,&local_a0,&local_6c,value,version);
  if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::ByteData256::GetBytes(&local_a0.data_,&local_88);
  core::ByteData::ByteData(__return_storage_ptr__,&local_a0.data_);
  if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetElementsSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}